

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::RequestToken
          (CommissionerImpl *this,Handler<ByteArray> *aHandler,string *aAddr,uint16_t aPort)

{
  uint uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  local_158;
  anon_class_1_0_00000001 local_122;
  v10 local_121;
  v10 *local_120;
  size_t local_118;
  string local_110;
  Error local_f0;
  uint16_t local_c2;
  string *psStack_c0;
  uint16_t aPort_local;
  string *aAddr_local;
  Handler<ByteArray> *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  CommissionerImpl **local_38;
  undefined1 *local_30;
  CommissionerImpl **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  CommissionerImpl **local_10;
  
  local_c2 = aPort;
  psStack_c0 = aAddr;
  aAddr_local = (string *)aHandler;
  aHandler_local = (Handler<ByteArray> *)this;
  uVar1 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
  if ((uVar1 & 1) == 0) {
    RequestToken::anon_class_1_0_00000001::operator()(&local_122);
    local_58 = &local_120;
    local_60 = &local_121;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_118 = bVar2.size_;
    local_120 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_78 = local_120;
    sStack_70 = local_118;
    local_50 = &local_78;
    local_88 = local_120;
    local_80 = local_118;
    local_68 = &local_110;
    local_48 = local_88;
    sStack_40 = local_80;
    this_local = (CommissionerImpl *)
                 ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &this_local;
    local_20 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_110,local_88,fmt,args);
    Error::Error(&local_f0,kInvalidState,&local_110);
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::operator()(aHandler,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,&local_f0);
    Error::~Error(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  else {
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::function(&local_158,aHandler);
    TokenManager::RequestToken(&this->mTokenManager,&local_158,psStack_c0,local_c2);
    std::
    function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
    ::~function(&local_158);
  }
  return;
}

Assistant:

void CommissionerImpl::RequestToken(Handler<ByteArray> aHandler, const std::string &aAddr, uint16_t aPort)
{
    if (!IsCcmMode())
    {
        aHandler(nullptr, ERROR_INVALID_STATE("requesting COM_TOK is only valid in CCM Mode"));
    }
    else
    {
        mTokenManager.RequestToken(aHandler, aAddr, aPort);
    }
}